

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O3

void anon_unknown.dwarf_2761c7::fillPixels
               (int *pImageHeight,int *pImageWidth,Array2D<Imath_3_2::half> *pPixels,int pNbChannels
               ,bool pIsLeft)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  half rgbaValue [4];
  half local_38 [4];
  
  iVar1 = *pImageHeight;
  if (0 < iVar1) {
    uVar5 = (ulong)(uint)*pImageWidth;
    lVar4 = 0;
    lVar3 = 0;
    do {
      if (0 < (int)uVar5) {
        lVar2 = 0;
        lVar6 = 0;
        do {
          generatePixel((int)lVar3,(int)lVar6,local_38,pIsLeft);
          memcpy((void *)((long)&pPixels->_data->_h + lVar2 + pPixels->_sizeY * lVar4),local_38,
                 (ulong)(uint)pNbChannels * 2);
          lVar6 = lVar6 + 1;
          uVar5 = (ulong)*pImageWidth;
          lVar2 = lVar2 + (long)pNbChannels * 2;
        } while (lVar6 < (long)uVar5);
        iVar1 = *pImageHeight;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 2;
    } while (lVar3 < iVar1);
  }
  return;
}

Assistant:

void
fillPixels (
    const int&     pImageHeight,
    const int&     pImageWidth,
    Array2D<half>& pPixels,
    int            pNbChannels,
    bool           pIsLeft)
{
    for (int i = 0; i < pImageHeight; ++i)
    {
        for (int j = 0; j < pImageWidth; ++j)
        {
            half rgbaValue[4];

            generatePixel (i, j, &rgbaValue[0], pIsLeft);
            memcpy (
                (void*) &pPixels[i][j * pNbChannels],
                &rgbaValue[0],
                pNbChannels * sizeof (half));
        }
    }
}